

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translit.cpp
# Opt level: O2

void icu_63::Transliterator::registerFactory(UnicodeString *id,Factory factory,Token context)

{
  UBool UVar1;
  UErrorCode ec;
  Mutex lock;
  UErrorCode local_24;
  Mutex local_20;
  
  local_20.fMutex = &registryMutex;
  umtx_lock_63(&registryMutex);
  local_24 = U_ZERO_ERROR;
  if (registry == (TransliteratorRegistry *)0x0) {
    UVar1 = initializeRegistry(&local_24);
    if (UVar1 == '\0') goto LAB_00272274;
  }
  _registerFactory(id,factory,context);
LAB_00272274:
  Mutex::~Mutex(&local_20);
  return;
}

Assistant:

void U_EXPORT2 Transliterator::registerFactory(const UnicodeString& id,
                                     Transliterator::Factory factory,
                                     Transliterator::Token context) {
    Mutex lock(&registryMutex);
    UErrorCode ec = U_ZERO_ERROR;
    if (HAVE_REGISTRY(ec)) {
        _registerFactory(id, factory, context);
    }
}